

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O2

string * __thiscall
toml::format_error_abi_cxx11_(string *__return_storage_ptr__,toml *this,error_info *err)

{
  ostream *poVar1;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = color::ansi::red((ostream *)local_190);
  poVar1 = color::ansi::bold(poVar1);
  poVar1 = std::operator<<(poVar1,"[error]");
  color::ansi::reset(poVar1);
  std::__cxx11::stringbuf::str();
  format_error(__return_storage_ptr__,&local_1b0,(error_info *)this);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string format_error(const error_info& err)
{
    std::ostringstream oss;
    oss << color::red << color::bold << "[error]" << color::reset;
    return format_error(oss.str(), err);
}